

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

string * __thiscall
iutest::detail::ElementsAreMatcherBase::
WhichIsElem<2,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers,int index)

{
  ostream *poVar1;
  iu_global_format_stringstream strm;
  undefined1 local_1a0 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  poVar1 = std::operator<<((ostream *)(local_1a0 + 0x10),"ElementsAre(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)matchers);
  poVar1 = std::operator<<(poVar1,"): ");
  detail::operator<<(poVar1,(NeMatcher<int> *)(this + 2));
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIsElem(const T& matchers, int index)
    {
        iu_global_format_stringstream strm;
        strm << "ElementsAre(" << index << "): " << tuples::get<N>(matchers);
        return strm.str();
    }